

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udplayer.cc
# Opt level: O0

int __thiscall
RestrictedUdpLayer::receiveUdpPacket
          (RestrictedUdpLayer *this,void *data,int *size,sockaddr_in *from)

{
  bool bVar1;
  int iVar2;
  pointer this_00;
  _Self local_50;
  _List_node_base *local_48;
  _List_iterator<PortRange> local_40;
  iterator it;
  uint16_t inPort;
  sockaddr_in *from_local;
  int *size_local;
  void *data_local;
  RestrictedUdpLayer *this_local;
  
  iVar2 = UdpLayer::receiveUdpPacket(&this->super_UdpLayer,data,size,from);
  if (iVar2 < 1) {
    this_local._4_4_ = -1;
  }
  else {
    it._M_node._6_2_ = ntohs(from->sin_port);
    std::_List_iterator<PortRange>::_List_iterator(&local_40);
    local_48 = (_List_node_base *)
               std::__cxx11::list<PortRange,_std::allocator<PortRange>_>::begin(&this->mLostPorts);
    local_40._M_node = local_48;
    while( true ) {
      local_50._M_node =
           (_List_node_base *)
           std::__cxx11::list<PortRange,_std::allocator<PortRange>_>::end(&this->mLostPorts);
      bVar1 = std::operator!=(&local_40,&local_50);
      if (!bVar1) break;
      this_00 = std::_List_iterator<PortRange>::operator->(&local_40);
      bVar1 = PortRange::inRange(this_00,it._M_node._6_2_);
      if (bVar1) {
        *size = 0;
        return -1;
      }
      std::_List_iterator<PortRange>::operator++(&local_40,0);
    }
    this_local._4_4_ = *size;
  }
  return this_local._4_4_;
}

Assistant:

int RestrictedUdpLayer::receiveUdpPacket(void *data, int *size, struct sockaddr_in &from) {
	if (0 < UdpLayer::receiveUdpPacket(data, size, from)) {
		/* check the port against list */
		uint16_t inPort = ntohs(from.sin_port);

		std::list<PortRange>::iterator it;
		for (it = mLostPorts.begin(); it != mLostPorts.end(); it++) {
			if (it->inRange(inPort)) {
#ifdef DEBUG_UDP_LAYER 	
				std::cerr << "RestrictedUdpLayer::receiveUdpPacket() Dropping packet";
				std::cerr << ", Port(" << inPort << ") in restricted range!";
				std::cerr << std::endl;
				//std::cerr << printPkt(data, *size);
				//std::cerr << std::endl;
#endif

				*size = 0;
				return -1;
	
			}
	
		}

#ifdef DEBUG_UDP_LAYER 	
		std::cerr << "RestrictedUdpLayer::receiveUdpPacket() Accepting packet";
		std::cerr << ", Port(" << inPort << ") in Okay range!";
		std::cerr << std::endl;
#endif
		/* acceptable port */
		return *size;
	}
	return -1;
}